

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O2

void llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call(void *Ptr)

{
  if (Ptr != (void *)0x0) {
    SmallPtrSetImplBase::~SmallPtrSetImplBase((SmallPtrSetImplBase *)((long)Ptr + 0xe8));
    SmallPtrSetImplBase::~SmallPtrSetImplBase((SmallPtrSetImplBase *)((long)Ptr + 0x48));
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)((long)Ptr + 0x30)
              );
    std::__cxx11::string::_M_dispose();
  }
  operator_delete(Ptr,0x130);
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }